

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O3

bool __thiscall EditDistance::propagate(EditDistance *this)

{
  ExplLevel EVar1;
  int *piVar2;
  long lVar3;
  IntVar *pIVar4;
  int iVar5;
  Clause *pCVar6;
  long lVar7;
  bool bVar8;
  int upperBound;
  int *pt;
  EdExplFinder edExplFinder;
  
  iVar5 = this->seqSize * this->max_id_cost * 2;
  upperBound = this->max_id_cost * this->cellChanges * 2 + (this->lastBound).v;
  if (iVar5 <= upperBound) {
    upperBound = iVar5;
  }
  updateDpMatrix(this,upperBound);
  this->cellChanges = 0;
  iVar5 = this->seqSize;
  if (0 < iVar5) {
    piVar2 = (this->cellHasChanged).data;
    lVar7 = 0;
    do {
      piVar2[lVar7] = 0;
      lVar7 = lVar7 + 1;
      iVar5 = this->seqSize;
    } while (SBORROW8(lVar7,(long)iVar5 * 2) != lVar7 + (long)iVar5 * -2 < 0);
  }
  iVar5 = (this->dpMatrix).data[(uint)((iVar5 + 2) * iVar5)];
  edExplFinder.seq2._0_4_ = (this->lastBound).v;
  edExplFinder.seq2._4_4_ = 4;
  edExplFinder.seq1 = (IntView<0> *)&this->lastBound;
  vec<TrailElem>::push(&engine.trail,(TrailElem *)&edExplFinder);
  (this->lastBound).v = iVar5;
  bVar8 = true;
  if ((((this->ed).var)->min).v < iVar5) {
    EVar1 = this->explLevel;
    if ((EVar1 == E_NAIVE) && (0 < (long)this->seqSize)) {
      lVar7 = 0;
      do {
        lVar3 = *(long *)((long)&this->seq1->var + lVar7);
        if (*(int *)(lVar3 + 0xc) != *(int *)(lVar3 + 0x10)) {
          return true;
        }
        lVar3 = *(long *)((long)&this->seq2->var + lVar7);
        if (*(int *)(lVar3 + 0xc) != *(int *)(lVar3 + 0x10)) {
          return true;
        }
        lVar7 = lVar7 + 0x10;
      } while ((long)this->seqSize * 0x10 != lVar7);
    }
    if (so.lazy == true) {
      if (EVar1 == E_FULL) {
        EdExplFinder::EdExplFinder(&edExplFinder);
        pCVar6 = EdExplFinder::FindEdExplanation
                           (&edExplFinder,*(int *)&(this->super_Propagator).field_0x14,
                            &this->insertion_cost,&this->deletion_cost,&this->substitution_cost,
                            this->seq1,this->seq2,&this->dpMatrix,iVar5,this->seqSize,
                            this->min_id_cost);
        EdExplFinder::~EdExplFinder(&edExplFinder);
      }
      else if (EVar1 == E_NAIVE) {
        pCVar6 = getNaiveExplanation(this);
      }
      else {
        pCVar6 = (Clause *)0x0;
      }
      pIVar4 = (this->ed).var;
      iVar5 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xe])
                        (pIVar4,(long)iVar5,pCVar6,1);
      if ((char)iVar5 == '\0') {
        bVar8 = false;
      }
    }
  }
  return bVar8;
}

Assistant:

bool propagate() override {
		// Step 1:
		// Update dp matrix according to change
		//

#ifndef NDEBUG
		std::cout << "lastBound = " << lastBound << '\n';
		std::cout << "cellChanges = " << cellChanges << '\n';
		std::cout << "cellHasChanged = [";
		for (int i = 0; i < seqSize * 2; i++) {
			std::cout << cellHasChanged[i] << " ";
		}
		std::cout << "]" << '\n';
#endif

		const int ub = std::min(2 * seqSize * max_id_cost, lastBound + cellChanges * 2 * max_id_cost);

		updateDpMatrix(ub);
		cellChanges = 0;
		for (int i = 0; i < seqSize * 2; i++) {
			cellHasChanged[i] = 0;
		}

#ifndef NDEBUG
		printCurrentDpMatrix();
#endif

		// Step 2:
		// Propagate lower bound to edit distance, and add explanation
		//

		// calc edit distance
		const int editDistanceLB = getEditDistanceLB();

		lastBound = editDistanceLB;

		if (ed.getMin() < editDistanceLB) {
#ifndef NDEBUG
			std::cout << "ED " << editDistanceLB << '\n';
#endif

			if (explLevel == E_NAIVE) {
				// in case of naive explanation, check if all variables are fixed
				for (int i = 0; i < seqSize; i++) {
					if (!seq1[i].isFixed() || !seq2[i].isFixed()) {
						return true;
					}
				}
			}
			if (ed.setMinNotR(editDistanceLB)) {
				Clause* r = nullptr;
				if (so.lazy) {
					switch (explLevel) {
						case E_NAIVE:
							r = getNaiveExplanation();
							break;
						case E_FULL:
							EdExplFinder edExplFinder;
							// launch inequality finder for explanation
							r = edExplFinder.FindEdExplanation(max_char, &insertion_cost, &deletion_cost,
																								 &substitution_cost, seq1, seq2, &dpMatrix,
																								 editDistanceLB, seqSize, min_id_cost);
							break;
					}

					if (!ed.setMin(editDistanceLB, r)) {
						return false;
					}
				}
			}
		}

		return true;
	}